

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_sgemm.h
# Opt level: O2

void ncnn::conv_im2col_sgemm_transform_kernel_sse
               (Mat *_kernel,Mat *kernel_tm,int inch,int outch,int kernel_size)

{
  void *pvVar1;
  void *pvVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  int iVar12;
  undefined4 *puVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  bool bVar21;
  Mat local_78;
  
  pvVar1 = _kernel->data;
  uVar9 = 0;
  Mat::create(kernel_tm,kernel_size * 8,inch,
              outch / 8 + outch % 4 + (int)(char)((char)(outch % 8) / '\x04'),4,(Allocator *)0x0);
  iVar12 = kernel_size * inch;
  iVar3 = 0;
  if (0 < iVar12) {
    iVar3 = iVar12;
  }
  uVar7 = (ulong)(uint)(outch >> 3);
  if (outch >> 3 < 1) {
    uVar7 = uVar9;
  }
  iVar4 = iVar12 * 8;
  iVar14 = iVar12 * 2;
  iVar15 = iVar12 * 3;
  iVar16 = iVar12 * 4;
  iVar17 = iVar12 * 5;
  iVar18 = iVar12 * 6;
  iVar19 = iVar12 * 7;
  iVar20 = iVar12;
  for (uVar11 = 0; uVar11 != uVar7; uVar11 = uVar11 + 1) {
    Mat::channel(&local_78,kernel_tm,(int)uVar11);
    pvVar2 = local_78.data;
    Mat::~Mat(&local_78);
    lVar8 = 0;
    iVar5 = iVar3;
    while (bVar21 = iVar5 != 0, iVar5 = iVar5 + -1, bVar21) {
      *(undefined4 *)((long)pvVar2 + lVar8 * 2 * 4) =
           *(undefined4 *)((long)pvVar1 + lVar8 + (long)(int)uVar9 * 4);
      *(undefined4 *)((long)pvVar2 + (lVar8 * 2 + 1) * 4) =
           *(undefined4 *)((long)pvVar1 + lVar8 + (long)iVar20 * 4);
      *(undefined4 *)((long)pvVar2 + (lVar8 * 2 + 2) * 4) =
           *(undefined4 *)((long)pvVar1 + lVar8 + (long)iVar14 * 4);
      *(undefined4 *)((long)pvVar2 + (lVar8 * 2 + 3) * 4) =
           *(undefined4 *)((long)pvVar1 + lVar8 + (long)iVar15 * 4);
      *(undefined4 *)((long)pvVar2 + (lVar8 * 2 + 4) * 4) =
           *(undefined4 *)((long)pvVar1 + lVar8 + (long)iVar16 * 4);
      *(undefined4 *)((long)pvVar2 + (lVar8 * 2 + 5) * 4) =
           *(undefined4 *)((long)pvVar1 + lVar8 + (long)iVar17 * 4);
      *(undefined4 *)((long)pvVar2 + (lVar8 * 2 + 6) * 4) =
           *(undefined4 *)((long)pvVar1 + lVar8 + (long)iVar18 * 4);
      *(undefined4 *)((long)pvVar2 + (lVar8 * 2 + 7) * 4) =
           *(undefined4 *)((long)pvVar1 + lVar8 + (long)iVar19 * 4);
      lVar8 = lVar8 + 4;
    }
    uVar9 = (ulong)(uint)((int)uVar9 + iVar4);
    iVar20 = iVar20 + iVar4;
    iVar14 = iVar14 + iVar4;
    iVar15 = iVar15 + iVar4;
    iVar16 = iVar16 + iVar4;
    iVar17 = iVar17 + iVar4;
    iVar18 = iVar18 + iVar4;
    iVar19 = iVar19 + iVar4;
  }
  uVar10 = outch & 0xfffffff8;
  uVar6 = (uint)outch >> 2 & 1;
  iVar15 = kernel_size * inch;
  iVar14 = ((uint)outch >> 3) * iVar15 * 8;
  iVar17 = iVar15 * 4;
  iVar20 = (uVar10 + 1) * iVar15;
  iVar4 = (uVar10 + 2) * iVar15;
  iVar16 = (uVar10 | 3) * iVar15;
  for (uVar9 = 0; uVar9 != uVar6; uVar9 = uVar9 + 1) {
    iVar18 = uVar10 + (int)uVar9 * 4;
    Mat::channel(&local_78,kernel_tm,(iVar18 % 8 >> 2) + iVar18 / 8);
    puVar13 = (undefined4 *)local_78.data;
    Mat::~Mat(&local_78);
    for (lVar8 = 0; iVar3 != (int)lVar8; lVar8 = lVar8 + 1) {
      *puVar13 = *(undefined4 *)((long)pvVar1 + lVar8 * 4 + (long)iVar14 * 4);
      puVar13[1] = *(undefined4 *)((long)pvVar1 + lVar8 * 4 + (long)iVar20 * 4);
      puVar13[2] = *(undefined4 *)((long)pvVar1 + lVar8 * 4 + (long)iVar4 * 4);
      puVar13[3] = *(undefined4 *)((long)pvVar1 + lVar8 * 4 + (long)iVar16 * 4);
      puVar13 = puVar13 + 4;
    }
    iVar14 = iVar14 + iVar17;
    iVar20 = iVar20 + iVar17;
    iVar4 = iVar4 + iVar17;
    iVar16 = iVar16 + iVar17;
  }
  iVar17 = uVar10 + uVar6 * 4;
  iVar15 = iVar15 * iVar17;
  for (uVar9 = (ulong)iVar17; (long)uVar9 < (long)outch; uVar9 = uVar9 + 1) {
    uVar6 = (int)uVar9 >> 0x1f;
    uVar7 = (ulong)uVar6 << 0x20 | uVar9 & 0xffffffff;
    Mat::channel(&local_78,kernel_tm,
                 (int)((long)((ulong)uVar6 << 0x20 | uVar9 & 0xffffffff) % 4) +
                 (int)((long)uVar7 / 8) + (int)(char)((char)((long)uVar7 % 8) / '\x04'));
    pvVar2 = local_78.data;
    Mat::~Mat(&local_78);
    for (lVar8 = 0; iVar3 != (int)lVar8; lVar8 = lVar8 + 1) {
      *(undefined4 *)((long)pvVar2 + lVar8 * 4) =
           *(undefined4 *)((long)pvVar1 + lVar8 * 4 + (long)iVar15 * 4);
    }
    iVar15 = iVar15 + iVar12;
  }
  return;
}

Assistant:

static void conv_im2col_sgemm_transform_kernel_sse(const Mat& _kernel, Mat& kernel_tm, int inch, int outch, int kernel_size)
{
    const float* kernel = _kernel;

    // kernel memory packed 8 x 8
    kernel_tm.create(8 * kernel_size, inch, outch / 8 + (outch % 8) / 4 + outch % 4);

    int nn_outch = 0;
    int remain_outch_start = 0;

    nn_outch = outch >> 3;
    remain_outch_start = nn_outch << 3;

    for (int pp = 0; pp < nn_outch; pp++)
    {
        int p = pp * 8;

        const float* k0 = kernel + (p + 0) * inch * kernel_size;
        const float* k1 = kernel + (p + 1) * inch * kernel_size;
        const float* k2 = kernel + (p + 2) * inch * kernel_size;
        const float* k3 = kernel + (p + 3) * inch * kernel_size;
        const float* k4 = kernel + (p + 4) * inch * kernel_size;
        const float* k5 = kernel + (p + 5) * inch * kernel_size;
        const float* k6 = kernel + (p + 6) * inch * kernel_size;
        const float* k7 = kernel + (p + 7) * inch * kernel_size;

        float* ktmp = kernel_tm.channel(p / 8);

        for (int q = 0; q < inch * kernel_size; q++)
        {
            ktmp[0] = k0[0];
            ktmp[1] = k1[0];
            ktmp[2] = k2[0];
            ktmp[3] = k3[0];
            ktmp[4] = k4[0];
            ktmp[5] = k5[0];
            ktmp[6] = k6[0];
            ktmp[7] = k7[0];
            ktmp += 8;

            k0 += 1;
            k1 += 1;
            k2 += 1;
            k3 += 1;
            k4 += 1;
            k5 += 1;
            k6 += 1;
            k7 += 1;
        }
    }

    nn_outch = (outch - remain_outch_start) >> 2;

    for (int pp = 0; pp < nn_outch; pp++)
    {
        int p = remain_outch_start + pp * 4;

        const float* k0 = kernel + (p + 0) * inch * kernel_size;
        const float* k1 = kernel + (p + 1) * inch * kernel_size;
        const float* k2 = kernel + (p + 2) * inch * kernel_size;
        const float* k3 = kernel + (p + 3) * inch * kernel_size;

        float* ktmp = kernel_tm.channel(p / 8 + (p % 8) / 4);

        for (int q = 0; q < inch * kernel_size; q++)
        {
            ktmp[0] = k0[0];
            ktmp[1] = k1[0];
            ktmp[2] = k2[0];
            ktmp[3] = k3[0];
            ktmp += 4;

            k0 += 1;
            k1 += 1;
            k2 += 1;
            k3 += 1;
        }
    }

    remain_outch_start += nn_outch << 2;

    for (int p = remain_outch_start; p < outch; p++)
    {
        const float* k0 = kernel + (p + 0) * inch * kernel_size;

        float* ktmp = kernel_tm.channel(p / 8 + (p % 8) / 4 + p % 4);

        for (int q = 0; q < inch * kernel_size; q++)
        {
            ktmp[0] = k0[0];
            ktmp++;
            k0++;
        }
    }
}